

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar20 [16];
  int iVar24;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar30;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar37 [16];
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar50 [16];
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  undefined1 local_118 [16];
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  undefined1 local_b8 [16];
  long local_a8;
  int *local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_sse41_128_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_sse41_128_32_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_sse41_128_32_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_sse41_128_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_table_diag_sse41_128_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_table_diag_sse41_128_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar11 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_table_diag_sse41_128_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar11 = (ulong)(uint)matrix->length;
    }
    iVar14 = matrix->min;
    uVar4 = 0x80000000 - iVar14;
    if (iVar14 != -open && SBORROW4(iVar14,-open) == iVar14 + open < 0) {
      uVar4 = open | 0x80000000;
    }
    iVar14 = uVar4 + 1;
    uVar12 = 0x7ffffffe - matrix->max;
    local_88._4_4_ = iVar14;
    local_88._0_4_ = iVar14;
    local_88._8_4_ = iVar14;
    local_88._12_4_ = iVar14;
    local_e8._4_4_ = iVar14;
    local_e8._0_4_ = iVar14;
    local_e8._8_4_ = iVar14;
    local_e8._12_4_ = iVar14;
    local_b8._4_4_ = iVar14;
    local_b8._0_4_ = iVar14;
    local_b8._8_4_ = iVar14;
    local_b8._12_4_ = iVar14;
    uVar4 = (uint)uVar11;
    ppVar7 = parasail_result_new_table1(uVar4,s2Len);
    if (ppVar7 != (parasail_result_t *)0x0) {
      ppVar7->flag = ppVar7->flag | 0x4421004;
      uVar10 = (ulong)(s2Len + 6);
      local_c8 = open;
      ptr = parasail_memalign_int32_t(0x10,uVar10);
      ptr_00 = parasail_memalign_int32_t(0x10,uVar10);
      ptr_01 = parasail_memalign_int32_t(0x10,uVar10);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
        if (matrix->type == 0) {
          iVar17 = uVar4 + 3;
          ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar17);
          if (ptr_02 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar4) {
            piVar1 = matrix->mapper;
            uVar10 = 0;
            do {
              ptr_02[uVar10] = piVar1[(byte)_s1[uVar10]];
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
          }
          iVar6 = uVar4 + 1;
          if ((int)(uVar4 + 1) < iVar17) {
            iVar6 = iVar17;
          }
          memset(ptr_02 + (int)uVar4,0,(ulong)(~uVar4 + iVar6) * 4 + 4);
        }
        else {
          ptr_02 = (int32_t *)0x0;
        }
        uVar5 = s2Len + 3;
        local_68._4_4_ = iVar14;
        local_68._0_4_ = iVar14;
        local_68._8_4_ = iVar14;
        local_68._12_4_ = iVar14;
        local_68 = local_68 >> 0x20;
        iStack_c4 = local_c8;
        iStack_c0 = local_c8;
        iStack_bc = local_c8;
        piVar1 = matrix->mapper;
        uVar13 = (ulong)(uint)s2Len;
        uVar10 = 0;
        do {
          ptr[uVar10 + 3] = piVar1[(byte)_s2[uVar10]];
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
        ptr[2] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        uVar3 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar5) {
          uVar3 = uVar5;
        }
        uVar10 = 0;
        local_d8 = uVar12;
        uStack_d4 = uVar12;
        uStack_d0 = uVar12;
        uStack_cc = uVar12;
        local_78 = uVar4;
        uStack_74 = uVar4;
        uStack_70 = uVar4;
        uStack_6c = uVar4;
        local_58 = s2Len;
        iStack_54 = s2Len;
        iStack_50 = s2Len;
        iStack_4c = s2Len;
        local_48 = gap;
        iStack_44 = gap;
        iStack_40 = gap;
        iStack_3c = gap;
        memset(ptr + uVar13 + 3,0,(ulong)(~s2Len + uVar3) * 4 + 4);
        do {
          ptr_00[uVar10 + 3] = 0;
          ptr_01[uVar10 + 3] = iVar14;
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
        lVar8 = 0;
        do {
          ptr_00[lVar8] = iVar14;
          ptr_01[lVar8] = iVar14;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = uVar13 + 3;
        do {
          ptr_00[lVar8] = iVar14;
          ptr_01[lVar8] = iVar14;
          lVar8 = lVar8 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar5);
        if ((int)uVar4 < 1) {
          local_118._4_4_ = iVar14;
          local_118._0_4_ = iVar14;
          local_118._8_4_ = iVar14;
          local_118._12_4_ = iVar14;
          local_e8 = local_118;
          local_128 = local_d8;
          uStack_124 = uStack_d4;
          uStack_120 = uStack_d0;
          uStack_11c = uStack_cc;
        }
        else {
          local_a0 = matrix->matrix;
          local_90 = 1;
          if (1 < (int)uVar5) {
            local_90 = (ulong)uVar5;
          }
          uVar4 = uVar4 - 1;
          local_f0 = uVar13 * 0xc + -0xc;
          local_a8 = uVar13 * 0x10;
          local_f8 = uVar13 * 4 + -4;
          local_108 = uVar13 * 8 + -8;
          auVar37 = pmovsxbd(in_XMM5,0x10203);
          local_100 = 0;
          uVar10 = 0;
          local_128 = local_d8;
          uStack_124 = uStack_d4;
          uStack_120 = uStack_d0;
          uStack_11c = uStack_cc;
          local_b8 = local_e8;
          local_88 = local_e8;
          local_118 = local_e8;
          do {
            uVar16 = uVar10 | 3;
            if (matrix->type == 0) {
              uVar12 = ptr_02[uVar10];
              uVar5 = ptr_02[uVar10 + 1];
              uVar3 = ptr_02[uVar10 + 2];
              uVar15 = ptr_02[uVar16];
            }
            else {
              uVar12 = (uint)uVar10;
              uVar5 = uVar12 | 1;
              if (uVar11 <= (uVar10 | 1)) {
                uVar5 = uVar4;
              }
              uVar3 = uVar12 | 2;
              if (uVar11 <= (uVar10 | 2)) {
                uVar3 = uVar4;
              }
              uVar15 = uVar12 | 3;
              if (uVar11 <= uVar16) {
                uVar15 = uVar4;
              }
            }
            iVar17 = matrix->size;
            local_98 = uVar10;
            auVar46._0_4_ = -(uint)(auVar37._0_4_ < (int)local_78);
            iVar6 = auVar37._4_4_;
            auVar46._4_4_ = -(uint)(iVar6 < (int)uStack_74);
            iVar9 = auVar37._8_4_;
            auVar46._8_4_ = -(uint)(iVar9 < (int)uStack_70);
            iVar38 = auVar37._12_4_;
            auVar46._12_4_ = -(uint)(iVar38 < (int)uStack_6c);
            uVar18 = 0;
            in_XMM3 = pmovsxbd(in_XMM3,0xfffefd);
            auVar45._4_4_ = iVar14;
            auVar45._0_4_ = iVar14;
            auVar45._8_4_ = iVar14;
            auVar45._12_4_ = iVar14;
            auVar41 = local_68;
            auVar42 = local_68;
            auVar50 = auVar45;
            do {
              iVar19 = local_a0[(long)(int)(uVar15 * iVar17) + (long)ptr[uVar18]] + auVar41._0_4_;
              iVar21 = local_a0[(long)(int)(uVar3 * iVar17) + (long)ptr[uVar18 + 1]] + auVar41._4_4_
              ;
              iVar22 = local_a0[(long)(int)(uVar5 * iVar17) + (long)ptr[uVar18 + 2]] + auVar41._8_4_
              ;
              iVar23 = local_a0[(long)(int)(uVar12 * iVar17) + (long)ptr[uVar18 + 3]] +
                       auVar41._12_4_;
              iVar43 = auVar42._12_4_;
              auVar41._0_8_ = auVar42._4_8_;
              auVar40._0_12_ = auVar42._4_12_;
              auVar40._12_4_ = iVar43;
              auVar41._8_8_ = auVar40._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar18 + 3] << 0x20;
              iVar24 = auVar42._4_4_ - local_c8;
              iVar27 = auVar42._8_4_ - iStack_c4;
              iVar28 = iVar43 - iStack_c0;
              iVar29 = ptr_00[uVar18 + 3] - iStack_bc;
              iVar49 = auVar50._4_4_ - local_48;
              iVar51 = auVar50._8_4_ - iStack_44;
              iVar52 = auVar50._12_4_ - iStack_40;
              iVar53 = ptr_01[uVar18 + 3] - iStack_3c;
              auVar50._0_4_ = (uint)(iVar49 < iVar24) * iVar24 | (uint)(iVar49 >= iVar24) * iVar49;
              auVar50._4_4_ = (uint)(iVar51 < iVar27) * iVar27 | (uint)(iVar51 >= iVar27) * iVar51;
              auVar50._8_4_ = (uint)(iVar52 < iVar28) * iVar28 | (uint)(iVar52 >= iVar28) * iVar52;
              auVar50._12_4_ = (uint)(iVar53 < iVar29) * iVar29 | (uint)(iVar53 >= iVar29) * iVar53;
              iVar24 = auVar42._0_4_ - local_c8;
              iVar27 = auVar42._4_4_ - iStack_c4;
              iVar28 = auVar42._8_4_ - iStack_c0;
              iVar43 = iVar43 - iStack_bc;
              iVar29 = auVar45._0_4_ - local_48;
              iVar49 = auVar45._4_4_ - iStack_44;
              iVar51 = auVar45._8_4_ - iStack_40;
              iVar52 = auVar45._12_4_ - iStack_3c;
              auVar44._0_4_ = (uint)(iVar29 < iVar24) * iVar24 | (uint)(iVar29 >= iVar24) * iVar29;
              auVar44._4_4_ = (uint)(iVar49 < iVar27) * iVar27 | (uint)(iVar49 >= iVar27) * iVar49;
              auVar44._8_4_ = (uint)(iVar51 < iVar28) * iVar28 | (uint)(iVar51 >= iVar28) * iVar51;
              auVar44._12_4_ = (uint)(iVar52 < iVar43) * iVar43 | (uint)(iVar52 >= iVar43) * iVar52;
              uVar30 = ((int)auVar44._0_4_ < (int)auVar50._0_4_) * auVar50._0_4_ |
                       ((int)auVar44._0_4_ >= (int)auVar50._0_4_) * auVar44._0_4_;
              uVar33 = ((int)auVar44._4_4_ < (int)auVar50._4_4_) * auVar50._4_4_ |
                       ((int)auVar44._4_4_ >= (int)auVar50._4_4_) * auVar44._4_4_;
              uVar34 = ((int)auVar44._8_4_ < (int)auVar50._8_4_) * auVar50._8_4_ |
                       ((int)auVar44._8_4_ >= (int)auVar50._8_4_) * auVar44._8_4_;
              uVar35 = ((int)auVar44._12_4_ < (int)auVar50._12_4_) * auVar50._12_4_ |
                       ((int)auVar44._12_4_ >= (int)auVar50._12_4_) * auVar44._12_4_;
              iVar24 = (-1 < (int)uVar30) * uVar30;
              iVar29 = (-1 < (int)uVar33) * uVar33;
              iVar28 = (-1 < (int)uVar34) * uVar34;
              iVar27 = (-1 < (int)uVar35) * uVar35;
              auVar31._0_4_ = (uint)(iVar24 < iVar19) * iVar19 | (uint)(iVar24 >= iVar19) * iVar24;
              auVar31._4_4_ = (uint)(iVar29 < iVar21) * iVar21 | (uint)(iVar29 >= iVar21) * iVar29;
              auVar31._8_4_ = (uint)(iVar28 < iVar22) * iVar22 | (uint)(iVar28 >= iVar22) * iVar28;
              auVar31._12_4_ = (uint)(iVar27 < iVar23) * iVar23 | (uint)(iVar27 >= iVar23) * iVar27;
              iVar19 = in_XMM3._0_4_;
              auVar48._0_4_ = -(uint)(iVar19 == -1);
              iVar21 = in_XMM3._4_4_;
              auVar48._4_4_ = -(uint)(iVar21 == -1);
              iVar22 = in_XMM3._8_4_;
              iVar23 = in_XMM3._12_4_;
              auVar48._8_4_ = -(uint)(iVar22 == -1);
              auVar48._12_4_ = -(uint)(iVar23 == -1);
              auVar42 = ~auVar48 & auVar31;
              auVar25._4_4_ = iVar14;
              auVar25._0_4_ = iVar14;
              auVar25._8_4_ = iVar14;
              auVar25._12_4_ = iVar14;
              auVar50 = blendvps(auVar50,auVar25,auVar48);
              auVar45 = blendvps(auVar44,auVar25,auVar48);
              iVar29 = auVar42._0_4_;
              iVar24 = auVar42._4_4_;
              iVar28 = auVar42._12_4_;
              iVar27 = auVar42._8_4_;
              if (3 < uVar18) {
                local_128 = (uint)(iVar29 < (int)local_128) * iVar29 |
                            (iVar29 >= (int)local_128) * local_128;
                uStack_124 = (uint)(iVar24 < (int)uStack_124) * iVar24 |
                             (iVar24 >= (int)uStack_124) * uStack_124;
                uStack_120 = (uint)(iVar27 < (int)uStack_120) * iVar27 |
                             (iVar27 >= (int)uStack_120) * uStack_120;
                uStack_11c = (uint)(iVar28 < (int)uStack_11c) * iVar28 |
                             (iVar28 >= (int)uStack_11c) * uStack_11c;
                local_118._4_4_ =
                     (uint)((int)local_118._4_4_ < iVar24) * iVar24 |
                     (uint)((int)local_118._4_4_ >= iVar24) * local_118._4_4_;
                local_118._0_4_ =
                     (uint)((int)local_118._0_4_ < iVar29) * iVar29 |
                     (uint)((int)local_118._0_4_ >= iVar29) * local_118._0_4_;
                local_118._8_4_ =
                     (uint)((int)local_118._8_4_ < iVar27) * iVar27 |
                     (uint)((int)local_118._8_4_ >= iVar27) * local_118._8_4_;
                local_118._12_4_ =
                     (uint)((int)local_118._12_4_ < iVar28) * iVar28 |
                     (uint)((int)local_118._12_4_ >= iVar28) * local_118._12_4_;
              }
              piVar1 = ((ppVar7->field_4).rowcols)->score_row;
              if (uVar18 < uVar13) {
                *(int *)((long)piVar1 + uVar18 * 4 + local_100) = iVar28;
              }
              if (uVar18 - 1 < uVar13 && (uVar10 | 1) < uVar11) {
                *(int *)((long)piVar1 + uVar18 * 4 + local_f8) = iVar27;
              }
              if (((uVar10 | 2) < uVar11) && ((long)(uVar18 - 2) < (long)uVar13 && 1 < uVar18)) {
                *(int *)((long)piVar1 + uVar18 * 4 + local_108) = iVar24;
              }
              if (2 < uVar18 && uVar16 < uVar11) {
                *(int *)((long)piVar1 + uVar18 * 4 + local_f0) = iVar29;
              }
              ptr_00[uVar18] = iVar29;
              auVar20._0_4_ = -(uint)(iVar19 < local_58);
              auVar20._4_4_ = -(uint)(iVar21 < iStack_54);
              auVar20._8_4_ = -(uint)(iVar22 < iStack_50);
              auVar20._12_4_ = -(uint)(iVar23 < iStack_4c);
              auVar47._0_4_ = iVar19 >> 0x1f;
              auVar47._4_4_ = iVar21 >> 0x1f;
              auVar47._8_4_ = iVar22 >> 0x1f;
              auVar47._12_4_ = iVar23 >> 0x1f;
              auVar48 = ~auVar47 & auVar20 & auVar46;
              auVar39._0_4_ = -(uint)(iVar29 == local_88._0_4_);
              auVar39._4_4_ = -(uint)(iVar24 == local_88._4_4_);
              auVar39._8_4_ = -(uint)(iVar27 == local_88._8_4_);
              auVar39._12_4_ = -(uint)(iVar28 == local_88._12_4_);
              auVar36._0_4_ = -(uint)(local_88._0_4_ < iVar29);
              auVar36._4_4_ = -(uint)(local_88._4_4_ < iVar24);
              auVar36._8_4_ = -(uint)(local_88._8_4_ < iVar27);
              auVar36._12_4_ = -(uint)(local_88._12_4_ < iVar28);
              local_88 = blendvps(local_88,auVar31,auVar36 & auVar48);
              auVar32._0_4_ = -(uint)(iVar19 < local_b8._0_4_);
              auVar32._4_4_ = -(uint)(iVar21 < local_b8._4_4_);
              auVar32._8_4_ = -(uint)(iVar22 < local_b8._8_4_);
              auVar32._12_4_ = -(uint)(iVar23 < local_b8._12_4_);
              auVar25 = blendvps(auVar36 & auVar48,auVar48,auVar32 & auVar39);
              local_e8 = blendvps(local_e8,auVar37,auVar25);
              local_b8 = blendvps(local_b8,in_XMM3,(auVar32 & auVar39 | auVar36) & auVar48);
              ptr_01[uVar18] = auVar50._0_4_;
              in_XMM3._0_4_ = iVar19 + 1;
              in_XMM3._4_4_ = iVar21 + 1;
              in_XMM3._8_4_ = iVar22 + 1;
              in_XMM3._12_4_ = iVar23 + 1;
              uVar18 = uVar18 + 1;
            } while (local_90 != uVar18);
            auVar37._0_4_ = auVar37._0_4_ + 4;
            auVar37._4_4_ = iVar6 + 4;
            auVar37._8_4_ = iVar9 + 4;
            auVar37._12_4_ = iVar38 + 4;
            uVar10 = uVar10 + 4;
            local_f0 = local_f0 + local_a8;
            local_100 = local_100 + local_a8;
            local_f8 = local_f8 + local_a8;
            local_108 = local_108 + local_a8;
          } while (uVar10 < uVar11);
        }
        lVar8 = 0;
        iVar38 = 0;
        iVar6 = 0;
        iVar9 = 0;
        iVar17 = iVar14;
        do {
          iVar24 = *(int *)(local_88 + lVar8 * 4);
          if (iVar17 < iVar24) {
            iVar17 = iVar24;
            iVar6 = *(int *)(local_e8 + lVar8 * 4);
            iVar9 = *(int *)(local_b8 + lVar8 * 4);
            iVar38 = *(int *)(local_e8 + lVar8 * 4);
          }
          else if (iVar24 == iVar17) {
            iVar24 = *(int *)(local_b8 + lVar8 * 4);
            if (iVar24 < iVar9) {
              iVar6 = *(int *)(local_e8 + lVar8 * 4);
              iVar9 = iVar24;
              iVar38 = *(int *)(local_e8 + lVar8 * 4);
            }
            else if ((iVar24 == iVar9) &&
                    (iVar24 = *(int *)(local_e8 + lVar8 * 4), bVar2 = iVar24 < iVar6, iVar6 = iVar38
                    , bVar2)) {
              iVar6 = iVar24;
              iVar38 = iVar24;
            }
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 4);
        auVar42._0_4_ = -(uint)((int)local_128 < iVar14);
        auVar42._4_4_ = -(uint)((int)uStack_124 < iVar14);
        auVar42._8_4_ = -(uint)((int)uStack_120 < iVar14);
        auVar42._12_4_ = -(uint)((int)uStack_11c < iVar14);
        auVar26._0_4_ = -(uint)((int)local_d8 < local_118._0_4_);
        auVar26._4_4_ = -(uint)((int)uStack_d4 < local_118._4_4_);
        auVar26._8_4_ = -(uint)((int)uStack_d0 < local_118._8_4_);
        auVar26._12_4_ = -(uint)((int)uStack_cc < local_118._12_4_);
        iVar14 = movmskps(4,auVar26 | auVar42);
        if (iVar14 != 0) {
          *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
          iVar17 = 0;
          iVar9 = 0;
          iVar6 = 0;
        }
        ppVar7->score = iVar17;
        ppVar7->end_query = iVar6;
        ppVar7->end_ref = iVar9;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar7;
        }
        return ppVar7;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vJLimit = _mm_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            vWH = _mm_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi32(vJ, vNegOne),
                        _mm_cmplt_epi32(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi32(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi32(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi32(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}